

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O1

vector<YAML::Node,_std::allocator<YAML::Node>_> *
YAML::LoadAllFromFile
          (vector<YAML::Node,_std::allocator<YAML::Node>_> *__return_storage_ptr__,string *filename)

{
  BadFile *this;
  ifstream fin;
  long local_220 [4];
  byte abStack_200 [488];
  
  std::ifstream::ifstream(local_220,(string *)filename,_S_in);
  if ((abStack_200[*(long *)(local_220[0] + -0x18)] & 5) == 0) {
    LoadAll(__return_storage_ptr__,(istream *)local_220);
    std::ifstream::~ifstream(local_220);
    return __return_storage_ptr__;
  }
  this = (BadFile *)__cxa_allocate_exception(0x40);
  BadFile::BadFile(this,filename);
  __cxa_throw(this,&BadFile::typeinfo,BadFile::~BadFile);
}

Assistant:

std::vector<Node> LoadAllFromFile(const std::string& filename) {
  std::ifstream fin(filename);
  if (!fin) {
    throw BadFile(filename);
  }
  return LoadAll(fin);
}